

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Comments * __thiscall Json::Value::Comments::operator=(Comments *this,Comments *that)

{
  Comments *that_local;
  Comments *this_local;
  
  std::
  unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ::operator=(&this->ptr_,&that->ptr_);
  return this;
}

Assistant:

Value::Comments& Value::Comments::operator=(Comments&& that) {
  ptr_ = std::move(that.ptr_);
  return *this;
}